

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O3

void amrex::Arena::Initialize(void)

{
  int iVar1;
  PArena *this;
  CArena *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ArenaInfo info;
  ParmParse pp;
  string local_88;
  ParmParse local_68;
  
  if ((anonymous_namespace)::initialized == '\0') {
    (anonymous_namespace)::initialized = '\x01';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"amrex","");
    ParmParse::ParmParse(&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_arena_init_size",&(anonymous_namespace)::the_arena_init_size);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_device_arena_init_size",
               &(anonymous_namespace)::the_device_arena_init_size);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_managed_arena_init_size",
               &(anonymous_namespace)::the_managed_arena_init_size);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_pinned_arena_init_size",
               &(anonymous_namespace)::the_pinned_arena_init_size);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_arena_release_threshold",
               &(anonymous_namespace)::the_arena_release_threshold);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_device_arena_release_threshold",
               &(anonymous_namespace)::the_device_arena_release_threshold);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_managed_arena_release_threshold",
               &(anonymous_namespace)::the_managed_arena_release_threshold);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_pinned_arena_release_threshold",
               &(anonymous_namespace)::the_pinned_arena_release_threshold);
    ParmParse::queryAdd<long,_0>
              (&local_68,"the_async_arena_release_threshold",
               &(anonymous_namespace)::the_async_arena_release_threshold);
    ParmParse::queryAdd<bool,_0>
              (&local_68,"the_arena_is_managed",(bool *)&(anonymous_namespace)::the_arena_is_managed
              );
    ParmParse::queryAdd<bool,_0>
              (&local_68,"abort_on_out_of_gpu_memory",
               (bool *)&(anonymous_namespace)::abort_on_out_of_gpu_memory);
    anon_unknown_4::The_BArena();
    (anonymous_namespace)::the_arena = &anon_unknown_4::The_BArena::the_barena;
    this = (PArena *)operator_new(0x18);
    PArena::PArena(this,(anonymous_namespace)::the_async_arena_release_threshold);
    (anonymous_namespace)::the_async_arena = this;
    anon_unknown_4::The_BArena();
    (anonymous_namespace)::the_device_arena = &anon_unknown_4::The_BArena::the_barena;
    anon_unknown_4::The_BArena();
    (anonymous_namespace)::the_managed_arena = &anon_unknown_4::The_BArena::the_barena;
    this_00 = (CArena *)operator_new(0xd8);
    info.use_cpu_memory = false;
    info.device_use_managed_memory = false;
    info.device_set_readonly = false;
    info.device_set_preferred = false;
    info.device_use_hostalloc = true;
    info._13_3_ = 0;
    info.release_threshold = (anonymous_namespace)::the_pinned_arena_release_threshold;
    CArena::CArena(this_00,0,info);
    (anonymous_namespace)::the_pinned_arena = this_00;
    if ((0 < (anonymous_namespace)::the_device_arena_init_size) &&
       ((anonymous_namespace)::the_device_arena != (anonymous_namespace)::the_arena)) {
      iVar1 = (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[2])();
      (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[3])
                ((anonymous_namespace)::the_device_arena,CONCAT44(extraout_var,iVar1));
    }
    if ((0 < (anonymous_namespace)::the_managed_arena_init_size) &&
       ((anonymous_namespace)::the_managed_arena != (anonymous_namespace)::the_arena)) {
      iVar1 = (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[2])();
      (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[3])
                ((anonymous_namespace)::the_managed_arena,CONCAT44(extraout_var_00,iVar1));
    }
    if (0 < (anonymous_namespace)::the_pinned_arena_init_size) {
      iVar1 = (*((anonymous_namespace)::the_pinned_arena->super_Arena)._vptr_Arena[2])();
      (*((anonymous_namespace)::the_pinned_arena->super_Arena)._vptr_Arena[3])
                ((anonymous_namespace)::the_pinned_arena,CONCAT44(extraout_var_01,iVar1));
    }
    anon_unknown_4::The_BArena();
    (anonymous_namespace)::the_cpu_arena = &anon_unknown_4::The_BArena::the_barena;
    anon_unknown_4::The_Null_Arena();
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  }
  return;
}

Assistant:

void
Arena::Initialize ()
{
    if (initialized) return;
    initialized = true;

    BL_ASSERT(the_arena == nullptr);
    BL_ASSERT(the_async_arena == nullptr);
    BL_ASSERT(the_device_arena == nullptr);
    BL_ASSERT(the_managed_arena == nullptr);
    BL_ASSERT(the_pinned_arena == nullptr);
    BL_ASSERT(the_cpu_arena == nullptr);

#ifdef AMREX_USE_GPU
#ifdef AMREX_USE_DPCPP
    the_arena_init_size = 1024L*1024L*1024L; // xxxxx DPCPP: todo
#else
    the_arena_init_size = Gpu::Device::totalGlobalMem() / 4L * 3L;
#endif

    the_pinned_arena_release_threshold = Gpu::Device::totalGlobalMem();
#endif

    ParmParse pp("amrex");
    pp.queryAdd(        "the_arena_init_size",         the_arena_init_size);
    pp.queryAdd( "the_device_arena_init_size",  the_device_arena_init_size);
    pp.queryAdd("the_managed_arena_init_size", the_managed_arena_init_size);
    pp.queryAdd( "the_pinned_arena_init_size",  the_pinned_arena_init_size);
    pp.queryAdd(       "the_arena_release_threshold" ,         the_arena_release_threshold);
    pp.queryAdd( "the_device_arena_release_threshold",  the_device_arena_release_threshold);
    pp.queryAdd("the_managed_arena_release_threshold", the_managed_arena_release_threshold);
    pp.queryAdd( "the_pinned_arena_release_threshold",  the_pinned_arena_release_threshold);
    pp.queryAdd(  "the_async_arena_release_threshold",   the_async_arena_release_threshold);
    pp.queryAdd("the_arena_is_managed", the_arena_is_managed);
    pp.queryAdd("abort_on_out_of_gpu_memory", abort_on_out_of_gpu_memory);

    {
#if defined(BL_COALESCE_FABS) || defined(AMREX_USE_GPU)
        ArenaInfo ai{};
        ai.SetReleaseThreshold(the_arena_release_threshold);
        if (the_arena_is_managed) {
            the_arena = new CArena(0, ai.SetPreferred());
        } else {
            the_arena = new CArena(0, ai.SetDeviceMemory());
        }
#ifdef AMREX_USE_GPU
        void *p = the_arena->alloc(static_cast<std::size_t>(the_arena_init_size));
        the_arena->free(p);
#endif
#else
        the_arena = The_BArena();
#endif
    }

    the_async_arena = new PArena(the_async_arena_release_threshold);

#ifdef AMREX_USE_GPU
    if (the_arena->isDevice() || the_arena->isManaged()) {
        the_device_arena = the_arena;
    } else {
        the_device_arena = new CArena(0, ArenaInfo{}.SetDeviceMemory().SetReleaseThreshold
                                      (the_device_arena_release_threshold));
    }
#else
    the_device_arena = The_BArena();
#endif

#ifdef AMREX_USE_GPU
    if (the_arena->isManaged()) {
        the_managed_arena = the_arena;
    } else {
        the_managed_arena = new CArena(0, ArenaInfo{}.SetReleaseThreshold
                                       (the_managed_arena_release_threshold));
    }
#else
    the_managed_arena = The_BArena();
#endif

    // When USE_CUDA=FALSE, we call mlock to pin the cpu memory.
    // When USE_CUDA=TRUE, we call cudaHostAlloc to pin the host memory.
    the_pinned_arena = new CArena(0, ArenaInfo{}.SetHostAlloc().SetReleaseThreshold
                                  (the_pinned_arena_release_threshold));

    if (the_device_arena_init_size > 0 && the_device_arena != the_arena) {
        void *p = the_device_arena->alloc(the_device_arena_init_size);
        the_device_arena->free(p);
    }

    if (the_managed_arena_init_size > 0 && the_managed_arena != the_arena) {
        void *p = the_managed_arena->alloc(the_managed_arena_init_size);
        the_managed_arena->free(p);
    }

    if (the_pinned_arena_init_size > 0) {
        void *p = the_pinned_arena->alloc(the_pinned_arena_init_size);
        the_pinned_arena->free(p);
    }

    the_cpu_arena = The_BArena();

    // Initialize the null arena
    auto null_arena = The_Null_Arena();
    amrex::ignore_unused(null_arena);
}